

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkResizeVec(ARKodeMem ark_mem,ARKVecResizeFn resize,void *resize_data,sunindextype lrw_diff,
                sunindextype liw_diff,N_Vector tmpl,N_Vector *v)

{
  int iVar1;
  N_Vector p_Var2;
  int in_ECX;
  undefined8 in_RDX;
  code *in_RSI;
  ARKodeMem in_RDI;
  int in_R8D;
  N_Vector in_R9;
  
  if (tmpl->content != (void *)0x0) {
    if (in_RSI == (code *)0x0) {
      N_VDestroy((N_Vector)0x116292a);
      tmpl->content = (void *)0x0;
      p_Var2 = N_VClone(in_R9);
      tmpl->content = p_Var2;
      if (tmpl->content == (void *)0x0) {
        arkProcessError(in_RDI,-0x14,"ARKode","arkResizeVec","Unable to clone vector");
        return 0;
      }
    }
    else {
      iVar1 = (*in_RSI)(tmpl->content,in_R9,in_RDX);
      if (iVar1 != 0) {
        arkProcessError(in_RDI,-0x14,"ARKode","arkResizeVec",
                        "Error in user-supplied resize() function.");
        return 0;
      }
    }
    in_RDI->lrw = (long)in_ECX + in_RDI->lrw;
    in_RDI->liw = (long)in_R8D + in_RDI->liw;
  }
  return 1;
}

Assistant:

booleantype arkResizeVec(ARKodeMem ark_mem, ARKVecResizeFn resize,
                         void *resize_data, sunindextype lrw_diff,
                         sunindextype liw_diff, N_Vector tmpl, N_Vector *v)
{
  if (*v != NULL) {
    if (resize == NULL) {
      N_VDestroy(*v);
      *v = NULL;
      *v = N_VClone(tmpl);
      if (*v == NULL) {
        arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode",
                        "arkResizeVec", "Unable to clone vector");
        return(SUNFALSE);
      }
    } else {
      if (resize(*v, tmpl, resize_data)) {
        arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode",
                        "arkResizeVec", MSG_ARK_RESIZE_FAIL);
        return(SUNFALSE);
      }
    }
    ark_mem->lrw += lrw_diff;
    ark_mem->liw += liw_diff;
  }
  return(SUNTRUE);
}